

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::Option<Catch::AssertionResult>::reset(Option<Catch::AssertionResult> *this)

{
  if (this->nullableValue != (AssertionResult *)0x0) {
    AssertionResultData::~AssertionResultData(&this->nullableValue->m_resultData);
  }
  this->nullableValue = (AssertionResult *)0x0;
  return;
}

Assistant:

void reset() {
            if( nullableValue )
                nullableValue->~T();
            nullableValue = nullptr;
        }